

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

void __thiscall CHuffman::ConstructTree(CHuffman *this,uint *pFrequencies)

{
  long lVar1;
  long in_FS_OFFSET;
  int i;
  int NumNodesLeft;
  uint *pFrequencies_local;
  CHuffman *this_local;
  CHuffmanConstructNode *apNodesLeft [257];
  CHuffmanConstructNode aNodesLeftStorage [257];
  
  apNodesLeft[5] = (CHuffmanConstructNode *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  NumNodesLeft = 0x101;
  for (i = 0; i < 0x101; i = i + 1) {
    this->m_aNodes[i].m_NumBits = 0xffffffff;
    this->m_aNodes[i].m_Symbol = (uchar)i;
    this->m_aNodes[i].m_aLeafs[0] = 0xffff;
    this->m_aNodes[i].m_aLeafs[1] = 0xffff;
    if (i == 0x100) {
      aNodesLeftStorage[0x100].m_Frequency = 1;
    }
    else {
      aNodesLeftStorage[i].m_Frequency = pFrequencies[i];
    }
    aNodesLeftStorage[i].m_NodeId = (unsigned_short)i;
    apNodesLeft[i] = aNodesLeftStorage + i;
  }
  this->m_NumNodes = 0x101;
  for (; 1 < NumNodesLeft; NumNodesLeft = NumNodesLeft + -1) {
    BubbleSort(apNodesLeft,NumNodesLeft);
    this->m_aNodes[this->m_NumNodes].m_NumBits = 0;
    this->m_aNodes[this->m_NumNodes].m_aLeafs[0] = apNodesLeft[NumNodesLeft + -1]->m_NodeId;
    this->m_aNodes[this->m_NumNodes].m_aLeafs[1] = apNodesLeft[NumNodesLeft + -2]->m_NodeId;
    apNodesLeft[NumNodesLeft + -2]->m_NodeId = (unsigned_short)this->m_NumNodes;
    apNodesLeft[NumNodesLeft + -2]->m_Frequency =
         apNodesLeft[NumNodesLeft + -1]->m_Frequency + apNodesLeft[NumNodesLeft + -2]->m_Frequency;
    this->m_NumNodes = this->m_NumNodes + 1;
  }
  this->m_pStartNode = this->m_aNodes + (this->m_NumNodes + -1);
  Setbits_r(this,(CNode *)pFrequencies,NumNodesLeft,i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHuffman::ConstructTree(const unsigned *pFrequencies)
{
	CHuffmanConstructNode aNodesLeftStorage[HUFFMAN_MAX_SYMBOLS];
	CHuffmanConstructNode *apNodesLeft[HUFFMAN_MAX_SYMBOLS];
	int NumNodesLeft = HUFFMAN_MAX_SYMBOLS;

	// add the symbols
	for(int i = 0; i < HUFFMAN_MAX_SYMBOLS; i++)
	{
		m_aNodes[i].m_NumBits = 0xFFFFFFFF;
		m_aNodes[i].m_Symbol = i;
		m_aNodes[i].m_aLeafs[0] = 0xffff;
		m_aNodes[i].m_aLeafs[1] = 0xffff;

		if(i == HUFFMAN_EOF_SYMBOL)
			aNodesLeftStorage[i].m_Frequency = 1;
		else
			aNodesLeftStorage[i].m_Frequency = pFrequencies[i];
		aNodesLeftStorage[i].m_NodeId = i;
		apNodesLeft[i] = &aNodesLeftStorage[i];

	}

	m_NumNodes = HUFFMAN_MAX_SYMBOLS;

	// construct the table
	while(NumNodesLeft > 1)
	{
		// we can't rely on stdlib's qsort for this, it can generate different results on different implementations
		BubbleSort(apNodesLeft, NumNodesLeft);

		m_aNodes[m_NumNodes].m_NumBits = 0;
		m_aNodes[m_NumNodes].m_aLeafs[0] = apNodesLeft[NumNodesLeft-1]->m_NodeId;
		m_aNodes[m_NumNodes].m_aLeafs[1] = apNodesLeft[NumNodesLeft-2]->m_NodeId;
		apNodesLeft[NumNodesLeft-2]->m_NodeId = m_NumNodes;
		apNodesLeft[NumNodesLeft-2]->m_Frequency = apNodesLeft[NumNodesLeft-1]->m_Frequency + apNodesLeft[NumNodesLeft-2]->m_Frequency;

		m_NumNodes++;
		NumNodesLeft--;
	}

	// set start node
	m_pStartNode = &m_aNodes[m_NumNodes-1];

	// build symbol bits
	Setbits_r(m_pStartNode, 0, 0);
}